

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_linux.c
# Opt level: O1

int os_interface_linux_mac_set(os_interface *os_if,netaddr *mac)

{
  oonf_log_source oVar1;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  int iVar5;
  ifreq if_req;
  
  oVar1 = _oonf_os_interface_subsystem.logging;
  if (mac->_type == '/') {
    if_req.ifr_ifru.ifru_map.mem_start = 0;
    if_req.ifr_ifru.ifru_map.mem_end = 0;
    if_req.ifr_ifrn._0_8_ = 0;
    if_req.ifr_ifrn._8_8_ = 0;
    if_req.ifr_ifru._16_8_ = 0;
    strscpy((char *)&if_req,os_if->name,0x10);
    if_req.ifr_ifru.ifru_addr.sa_family = 1;
    netaddr_to_binary((void *)((long)&if_req.ifr_ifru + 2),mac,6);
    iVar2 = os_system_linux_linux_get_ioctl_fd(2);
    iVar5 = 0;
    iVar2 = ioctl(iVar2,0x8924,&if_req);
    oVar1 = _oonf_os_interface_subsystem.logging;
    if (iVar2 < 0) {
      iVar5 = -1;
      if ((log_global_mask[_oonf_os_interface_subsystem.logging] & 4) != 0) {
        puVar3 = (uint *)__errno_location();
        pcVar4 = strerror(*puVar3);
        oonf_log(LOG_SEVERITY_WARN,oVar1,"src/base/os_linux/os_interface_linux.c",0x20f,(void *)0x0,
                 0,"Could not set mac address of \'%s\': %s (%d)",os_if->name,pcVar4,(ulong)*puVar3)
        ;
      }
    }
  }
  else {
    iVar5 = -1;
    if ((log_global_mask[_oonf_os_interface_subsystem.logging] & 4) != 0) {
      pcVar4 = netaddr_to_prefixstring((netaddr_str *)&if_req,mac,false);
      oonf_log(LOG_SEVERITY_WARN,oVar1,"src/base/os_linux/os_interface_linux.c",0x204,(void *)0x0,0,
               "Interface MAC must mac48, not %s",pcVar4);
    }
  }
  return iVar5;
}

Assistant:

int
os_interface_linux_mac_set(struct os_interface *os_if, struct netaddr *mac) {
  struct ifreq if_req;
  struct netaddr_str nbuf;

  if (netaddr_get_address_family(mac) != AF_MAC48) {
    OONF_WARN(LOG_OS_INTERFACE, "Interface MAC must mac48, not %s", netaddr_to_string(&nbuf, mac));
    return -1;
  }

  memset(&if_req, 0, sizeof(if_req));
  strscpy(if_req.ifr_name, os_if->name, IF_NAMESIZE);

  if_req.ifr_addr.sa_family = ARPHRD_ETHER;
  netaddr_to_binary(&if_req.ifr_addr.sa_data, mac, 6);

  if (ioctl(os_system_linux_linux_get_ioctl_fd(AF_INET), SIOCSIFHWADDR, &if_req) < 0) {
    OONF_WARN(LOG_OS_INTERFACE, "Could not set mac address of '%s': %s (%d)", os_if->name, strerror(errno), errno);
    return -1;
  }
  return 0;
}